

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Property.cpp
# Opt level: O0

Property * Shell::Property::scan(UnitList *units)

{
  uint uVar1;
  uint uVar2;
  Symbol *pSVar3;
  Property *units_00;
  Property *in_stack_00000010;
  Property *prop;
  uint p;
  uint f;
  undefined8 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  uint uVar4;
  uint uVar5;
  
  uVar4 = 0;
  while( true ) {
    uVar5 = uVar4;
    uVar1 = Kernel::Signature::functions((Signature *)0xce5029);
    if (uVar1 <= uVar4) break;
    pSVar3 = Kernel::Signature::getFunction
                       ((Signature *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                        (uint)((ulong)in_stack_ffffffffffffffc8 >> 0x20));
    Kernel::Signature::Symbol::resetUsageCnt(pSVar3);
    pSVar3 = Kernel::Signature::getFunction
                       ((Signature *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                        (uint)((ulong)in_stack_ffffffffffffffc8 >> 0x20));
    Kernel::Signature::Symbol::resetUnitUsageCnt(pSVar3);
    uVar4 = uVar5 + 1;
  }
  uVar4 = 0;
  while( true ) {
    uVar1 = uVar4;
    uVar2 = Kernel::Signature::predicates((Signature *)0xce5098);
    if (uVar2 <= uVar4) break;
    pSVar3 = Kernel::Signature::getPredicate
                       ((Signature *)CONCAT44(uVar4,in_stack_ffffffffffffffd0),
                        (uint)((ulong)in_stack_ffffffffffffffc8 >> 0x20));
    Kernel::Signature::Symbol::resetUsageCnt(pSVar3);
    pSVar3 = Kernel::Signature::getPredicate
                       ((Signature *)CONCAT44(uVar4,in_stack_ffffffffffffffd0),
                        (uint)((ulong)in_stack_ffffffffffffffc8 >> 0x20));
    Kernel::Signature::Symbol::resetUnitUsageCnt(pSVar3);
    uVar4 = uVar1 + 1;
  }
  units_00 = (Property *)::operator_new(0x118);
  Property(in_stack_00000010);
  add((Property *)CONCAT44(uVar5,uVar1),(UnitList *)units_00);
  return units_00;
}

Assistant:

Property* Property::scan(UnitList* units)
{
  // a bit of a hack, these counts belong in Property
  for(unsigned f=0;f<env.signature->functions();f++){ 
    env.signature->getFunction(f)->resetUsageCnt(); 
    env.signature->getFunction(f)->resetUnitUsageCnt(); 
   }
  for(unsigned p=0;p<env.signature->predicates();p++){ 
    env.signature->getPredicate(p)->resetUsageCnt(); 
    env.signature->getPredicate(p)->resetUnitUsageCnt(); 
   }

  Property* prop = new Property;
  prop->add(units);
  return prop;
}